

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O1

variable_set * __thiscall
merlin::variable_set::operator-
          (variable_set *__return_storage_ptr__,variable_set *this,variable_set *B)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  vsize *pvVar5;
  pointer puVar6;
  pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_type __new_size;
  
  variable_set(__return_storage_ptr__,
               (long)(this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = (long)puVar3 - (long)puVar2 >> 3;
  if (puVar3 == puVar2) {
    __new_size = 0;
    uVar10 = 0;
  }
  else {
    puVar3 = (B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar5 = this->m_d;
    puVar6 = (__return_storage_ptr__->m_v).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (__return_storage_ptr__->m_dlocal).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    __new_size = 0;
    uVar12 = 0;
    do {
      if ((ulong)((long)puVar4 - (long)puVar3 >> 3) <= uVar12) break;
      uVar8 = puVar3[uVar12];
      if (puVar2[uVar10] < uVar8) {
        puVar7[__new_size] = pvVar5[uVar10];
        puVar1 = puVar2 + uVar10;
        uVar10 = uVar10 + 1;
        puVar6[__new_size] = *puVar1;
        __new_size = __new_size + 1;
      }
      else {
        if (puVar2[uVar10] == uVar8) {
          uVar10 = uVar10 + 1;
        }
        uVar12 = uVar12 + 1;
      }
    } while (uVar10 < uVar9);
  }
  if (uVar10 < uVar9) {
    pvVar5 = this->m_d;
    puVar3 = (__return_storage_ptr__->m_dlocal).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (__return_storage_ptr__->m_v).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      puVar3[__new_size + lVar11] = pvVar5[uVar10 + lVar11];
      puVar4[__new_size + lVar11] = puVar2[uVar10 + lVar11];
      lVar11 = lVar11 + 1;
    } while (uVar9 - uVar10 != lVar11);
    __new_size = __new_size + lVar11;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&__return_storage_ptr__->m_v,__new_size);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&__return_storage_ptr__->m_dlocal,__new_size);
  return __return_storage_ptr__;
}

Assistant:

variable_set operator-(const variable_set& B) const {
		variable_set dest(size());
		size_t i, j, k;
		for (i = 0, j = 0, k = 0; i < size() && j < B.size();) {
			if (m_v[i] < B.m_v[j]) {
				dest.m_dlocal[k] = m_d[i];
				dest.m_v[k++] = m_v[i++];
			} else if (m_v[i] == B.m_v[j]) {
				i++;
				j++;
			} else {
				j++;
			}
		}
		while (i < size()) {
			dest.m_dlocal[k] = m_d[i];
			dest.m_v[k++] = m_v[i++];
		}
		dest.m_v.resize(k);
		dest.m_dlocal.resize(k);
		return dest;
	}